

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall dtc::fdt::property::parse_string(property *this,text_input_buffer *input)

{
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  char cVar1;
  element_type *peVar2;
  _Elt_pointer psVar3;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  int iVar6;
  _Elt_pointer psVar7;
  bool bVar8;
  vector<char,_std::allocator<char>_> bytes;
  char c;
  property_value v;
  void *local_e8;
  iterator iStack_e0;
  char *local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  value_type local_38;
  
  local_a8 = 0;
  local_a0 = 0;
  local_90._0_8_ = local_90 + 0x10;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,&local_a0,&local_a0);
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = (pointer)0x0;
  puStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_38 = UNKNOWN;
  local_70._M_p = (pointer)&local_60;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  psVar4 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar3 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar3 != psVar4) {
    psVar5 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    psVar7 = psVar3;
    if (psVar3 == psVar5) {
      psVar7 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar6 = peVar2->cursor;
    if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) && (peVar2->buffer[iVar6] == '\"')) {
      input->cursor = input->cursor + 1;
      psVar7 = psVar3;
      if (psVar3 == psVar5) {
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      this_00 = &input->input_stack;
      peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar6 = peVar2->cursor + 1;
      peVar2->cursor = iVar6;
      if (peVar2->size <= iVar6) {
        std::
        deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
        ::pop_back(&this_00->c);
        psVar4 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar3 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      local_e8 = (void *)0x0;
      iStack_e0._M_current = (char *)0x0;
      local_d8 = (char *)0x0;
      if (psVar3 != psVar4) {
        bVar8 = false;
        do {
          psVar4 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          psVar5 = psVar3;
          if (psVar3 == psVar4) {
            psVar5 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar6 = peVar2->cursor;
          if (((long)iVar6 < 0) || (peVar2->size <= iVar6)) break;
          cVar1 = peVar2->buffer[iVar6];
          local_d0[0] = (long *)CONCAT71(local_d0[0]._1_7_,cVar1);
          if (cVar1 == '\"') {
            if (!bVar8) {
              psVar5 = psVar3;
              if (psVar3 == psVar4) {
                psVar5 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar6 = peVar2->cursor;
              if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) && (peVar2->buffer[iVar6] == '\"'))
              {
                input->cursor = input->cursor + 1;
                if (psVar3 == psVar4) {
                  psVar3 = (input->input_stack).c.
                           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                peVar2 = psVar3[-1].
                         super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar6 = peVar2->cursor + 1;
                peVar2->cursor = iVar6;
                if (peVar2->size <= iVar6) {
                  std::
                  deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ::pop_back(&this_00->c);
                }
              }
              break;
            }
          }
          else if (cVar1 == '\0') break;
          bVar8 = cVar1 == '\\';
          if (iStack_e0._M_current == local_d8) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&local_e8,iStack_e0,(char *)local_d0);
          }
          else {
            *iStack_e0._M_current = cVar1;
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
          psVar4 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          psVar3 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar3 == psVar4) break;
          input->cursor = input->cursor + 1;
          psVar5 = psVar3;
          if (psVar3 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar5 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar6 = peVar2->cursor + 1;
          peVar2->cursor = iVar6;
          if (peVar2->size <= iVar6) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&this_00->c);
            psVar4 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            psVar3 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
        } while (psVar3 != psVar4);
      }
      local_d0[0] = local_c0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)local_d0,local_e8,iStack_e0._M_current);
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_d0);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,(value_type *)local_90);
      if (local_e8 != (void *)0x0) {
        operator_delete(local_e8,(long)local_d8 - (long)local_e8);
      }
      if (local_50 != (pointer)0x0) {
        operator_delete(local_50,(long)local_40 - (long)local_50);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,
                        CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1)
        ;
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      return;
    }
  }
  __assert_fail("*input == \'\"\'",
                "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",0x105
                ,"void dtc::fdt::property::parse_string(text_input_buffer &)");
}

Assistant:

void
property::parse_string(text_input_buffer &input)
{
	property_value v;
	assert(*input == '"');
	++input;
	std::vector<char> bytes;
	bool isEscaped = false;
	while (char c = *input)
	{
		if (c == '"' && !isEscaped)
		{
			input.consume('"');
			break;
		}
		isEscaped = (c == '\\');
		bytes.push_back(c);
		++input;
	}
	v.string_data = string(bytes.begin(), bytes.end());
	values.push_back(v);
}